

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calculateCrossProducts
          (BeagleCPUImpl<double,_1,_1> *this,int *postBufferIndices,int *preBufferIndices,
          int *categoryRatesIndices,int *categoryWeightsIndices,double *edgeLengths,int count,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  iVar1 = (**(code **)(*in_RDI + 0x1c8))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateCrossProducts(const int *postBufferIndices,
                                                              const int *preBufferIndices,
                                                              const int *categoryRatesIndices,
                                                              const int *categoryWeightsIndices,
                                                              const double *edgeLengths,
                                                              int count,
                                                              double *outSumDerivatives,
                                                              double *outSumSquaredDerivatives) {
    return calcCrossProducts(
            postBufferIndices, preBufferIndices,
            categoryRatesIndices,
            categoryWeightsIndices,
            edgeLengths,
            count,
            outSumDerivatives,
            outSumSquaredDerivatives);
}